

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *
beagleGetFactoryList_abi_cxx11_(void)

{
  bool bVar1;
  list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *plVar2;
  reference ppPVar3;
  list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> factories;
  iterator plugin_iter;
  list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
  *in_stack_ffffffffffffff78;
  iterator in_stack_ffffffffffffffb8;
  iterator in_stack_ffffffffffffffc0;
  iterator local_38;
  _List_const_iterator<beagle::BeagleImplFactory_*> in_stack_ffffffffffffffd0;
  _List_iterator<beagle::BeagleImplFactory_*> in_stack_ffffffffffffffd8;
  _List_iterator<beagle::BeagleImplFactory_*> in_stack_ffffffffffffffe0;
  const_iterator in_stack_ffffffffffffffe8;
  _Self local_10;
  _Self local_8;
  
  if (implFactory_abi_cxx11_ ==
      (list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)0x0) {
    plVar2 = (list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)
             operator_new(0x18);
    std::__cxx11::list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::
    list((list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)0x11f65f
        );
    implFactory_abi_cxx11_ = plVar2;
    local_8._M_node =
         (_List_node_base *)
         std::__cxx11::list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>::
         begin((list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_> *)
               in_stack_ffffffffffffff78);
    while( true ) {
      local_10._M_node =
           (_List_node_base *)
           std::__cxx11::list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>::
           end((list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_> *)
               in_stack_ffffffffffffff78);
      bVar1 = std::operator!=(&local_8,&local_10);
      if (!bVar1) break;
      ppPVar3 = std::_List_iterator<beagle::plugin::Plugin_*>::operator*
                          ((_List_iterator<beagle::plugin::Plugin_*> *)0x11f6c1);
      (*(*ppPVar3)->_vptr_Plugin[2])();
      in_stack_ffffffffffffff78 =
           (list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)
           &stack0xffffffffffffffd8;
      std::__cxx11::list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
      ::list((list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)
             in_stack_ffffffffffffffc0._M_node,
             (list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)
             in_stack_ffffffffffffffb8._M_node);
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::end
                     (in_stack_ffffffffffffff78);
      std::_List_const_iterator<beagle::BeagleImplFactory_*>::_List_const_iterator
                ((_List_const_iterator<beagle::BeagleImplFactory_*> *)&stack0xffffffffffffffd0,
                 &local_38);
      in_stack_ffffffffffffffc0 =
           std::__cxx11::
           list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::begin
                     (in_stack_ffffffffffffff78);
      in_stack_ffffffffffffffb8 =
           std::__cxx11::
           list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::end
                     (in_stack_ffffffffffffff78);
      std::__cxx11::list<beagle::BeagleImplFactory*,std::allocator<beagle::BeagleImplFactory*>>::
      insert<std::_List_iterator<beagle::BeagleImplFactory*>,void>
                ((list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)
                 in_stack_ffffffffffffffd0._M_node,in_stack_ffffffffffffffe8,
                 in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      std::__cxx11::list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
      ::~list((list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)
              0x11f756);
      std::_List_iterator<beagle::plugin::Plugin_*>::operator++(&local_8,0);
    }
  }
  return implFactory_abi_cxx11_;
}

Assistant:

std::list<beagle::BeagleImplFactory*>* beagleGetFactoryList(void) {
    if (implFactory == NULL) {
        implFactory = new std::list<beagle::BeagleImplFactory*>;
        // Set-up a list of implementation factories in trial-order
        std::list<beagle::plugin::Plugin*>::iterator plugin_iter = plugins->begin();
        for(; plugin_iter != plugins->end(); plugin_iter++ ){
            std::list<beagle::BeagleImplFactory*> factories = (*plugin_iter)->getBeagleFactories();
            implFactory->insert(implFactory->end(), factories.begin(), factories.end());
        }
    }
    return implFactory;
}